

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.c
# Opt level: O2

void ma_channel_map_apply_f32
               (float *pFramesOut,ma_channel *pChannelMapOut,ma_uint32 channelsOut,float *pFramesIn,
               ma_channel *pChannelMapIn,ma_uint32 channelsIn,ma_uint64 frameCount,
               ma_channel_mix_mode mode,ma_mono_expansion_mode monoExpansionMode)

{
  float fVar1;
  ma_channel mVar2;
  ma_channel mVar3;
  ma_channel_conversion_path mVar4;
  uint uVar5;
  ulong uVar6;
  ma_uint32 channelIndex;
  ulong uVar7;
  ulong uVar8;
  float (*pafVar9) [32];
  ulong uVar10;
  ma_uint64 mVar11;
  ulong uVar12;
  float accumulation;
  float fVar13;
  float fVar14;
  float *local_1078;
  float weights [32] [32];
  
  mVar4 = ma_channel_map_get_conversion_path
                    (pChannelMapIn,channelsIn,pChannelMapOut,channelsOut,ma_channel_mix_mode_default
                    );
  uVar7 = (ulong)channelsOut;
  local_1078 = pFramesOut;
  if (mVar4 == ma_channel_conversion_path_mono_in) {
    if (pFramesIn != (float *)0x0 && (channelsOut != 0 && pFramesOut != (float *)0x0)) {
      for (mVar11 = 0; mVar11 != frameCount; mVar11 = mVar11 + 1) {
        for (uVar8 = 0; uVar7 != uVar8; uVar8 = uVar8 + 1) {
          mVar2 = ma_channel_map_get_channel(pChannelMapOut,channelsOut,(ma_uint32)uVar8);
          if (mVar2 != '\0') {
            local_1078[uVar8] = *pFramesIn;
          }
        }
        pFramesIn = pFramesIn + 1;
        local_1078 = local_1078 + uVar7;
      }
    }
  }
  else {
    uVar8 = (ulong)channelsIn;
    if (mVar4 == ma_channel_conversion_path_mono_out) {
      if (channelsIn != 0 && (pFramesIn != (float *)0x0 && pFramesOut != (float *)0x0)) {
        uVar5 = 0;
        for (channelIndex = 0; channelsIn != channelIndex; channelIndex = channelIndex + 1) {
          mVar2 = ma_channel_map_get_channel(pChannelMapIn,channelsIn,channelIndex);
          uVar5 = (uVar5 + 1) - (uint)(mVar2 == '\0');
        }
        if (uVar5 == 0) {
          channelsOut = 1;
          goto LAB_001917aa;
        }
        for (mVar11 = 0; mVar11 != frameCount; mVar11 = mVar11 + 1) {
          fVar13 = 0.0;
          for (uVar7 = 0; uVar8 != uVar7; uVar7 = uVar7 + 1) {
            mVar2 = ma_channel_map_get_channel(pChannelMapIn,channelsIn,(ma_uint32)uVar7);
            if (mVar2 != '\0') {
              fVar13 = fVar13 + pFramesIn[uVar7];
            }
          }
          *local_1078 = fVar13 / (float)uVar5;
          local_1078 = local_1078 + 1;
          pFramesIn = pFramesIn + uVar8;
        }
      }
    }
    else {
      if (mVar4 == ma_channel_conversion_path_passthrough) {
        ma_copy_pcm_frames(pFramesOut,pFramesIn,frameCount,ma_format_f32,channelsOut);
        return;
      }
      if (0xfe < channelsOut) {
LAB_001917aa:
        ma_silence_pcm_frames(pFramesOut,frameCount,ma_format_f32,channelsOut);
        return;
      }
      if (channelsOut < 0x21 && channelsIn < 0x21) {
        pafVar9 = weights;
        for (uVar6 = 0; uVar6 != uVar7; uVar6 = uVar6 + 1) {
          mVar2 = ma_channel_map_get_channel(pChannelMapOut,channelsOut,(ma_uint32)uVar6);
          for (uVar10 = 0; uVar8 != uVar10; uVar10 = uVar10 + 1) {
            mVar3 = ma_channel_map_get_channel(pChannelMapIn,channelsIn,(ma_uint32)uVar10);
            fVar13 = ma_calculate_channel_position_rectangular_weight(mVar2,mVar3);
            (*pafVar9)[uVar10] = fVar13;
          }
          pafVar9 = pafVar9 + 1;
        }
        for (uVar5 = 0; uVar5 < frameCount; uVar5 = uVar5 + 1) {
          pafVar9 = weights;
          for (uVar6 = 0; uVar6 != uVar7; uVar6 = uVar6 + 1) {
            fVar13 = 0.0;
            for (uVar10 = 0; uVar8 != uVar10; uVar10 = uVar10 + 1) {
              fVar13 = fVar13 + pFramesIn[uVar10] * (*pafVar9)[uVar10];
            }
            pFramesOut[uVar6] = fVar13;
            pafVar9 = pafVar9 + 1;
          }
          pFramesOut = pFramesOut + uVar7;
          pFramesIn = pFramesIn + uVar8;
        }
      }
      else {
        for (uVar6 = 0; uVar6 < frameCount; uVar6 = (ulong)((int)uVar6 + 1)) {
          for (uVar10 = 0; uVar10 != uVar7; uVar10 = uVar10 + 1) {
            mVar2 = ma_channel_map_get_channel(pChannelMapOut,channelsOut,(ma_uint32)uVar10);
            fVar13 = 0.0;
            for (uVar12 = 0; uVar8 != uVar12; uVar12 = uVar12 + 1) {
              mVar3 = ma_channel_map_get_channel(pChannelMapIn,channelsIn,(ma_uint32)uVar12);
              fVar1 = pFramesIn[uVar12];
              fVar14 = ma_calculate_channel_position_rectangular_weight(mVar2,mVar3);
              fVar13 = fVar13 + fVar14 * fVar1;
            }
            pFramesOut[uVar10] = fVar13;
          }
          pFramesOut = pFramesOut + uVar7;
          pFramesIn = pFramesIn + uVar8;
        }
      }
    }
  }
  return;
}

Assistant:

static void ma_channel_map_apply_f32(float* pFramesOut, const ma_channel* pChannelMapOut, ma_uint32 channelsOut, const float* pFramesIn, const ma_channel* pChannelMapIn, ma_uint32 channelsIn, ma_uint64 frameCount, ma_channel_mix_mode mode, ma_mono_expansion_mode monoExpansionMode)
{
    ma_channel_conversion_path conversionPath = ma_channel_map_get_conversion_path(pChannelMapIn, channelsIn, pChannelMapOut, channelsOut, mode);

    /* Optimized Path: Passthrough */
    if (conversionPath == ma_channel_conversion_path_passthrough) {
        ma_copy_pcm_frames(pFramesOut, pFramesIn, frameCount, ma_format_f32, channelsOut);
        return;
    }

    /* Special Path: Mono Output. */
    if (conversionPath == ma_channel_conversion_path_mono_out) {
        ma_channel_map_apply_mono_out_f32(pFramesOut, pFramesIn, pChannelMapIn, channelsIn, frameCount);
        return;
    }

    /* Special Path: Mono Input. */
    if (conversionPath == ma_channel_conversion_path_mono_in) {
        ma_channel_map_apply_mono_in_f32(pFramesOut, pChannelMapOut, channelsOut, pFramesIn, frameCount, monoExpansionMode);
        return;
    }

    /* Getting here means we aren't running on an optimized conversion path. */
    if (channelsOut <= MA_MAX_CHANNELS) {
        ma_result result;

        if (mode == ma_channel_mix_mode_simple) {
            ma_channel shuffleTable[MA_MAX_CHANNELS];

            result = ma_channel_map_build_shuffle_table(pChannelMapIn, channelsIn, pChannelMapOut, channelsOut, shuffleTable);
            if (result != MA_SUCCESS) {
                return;
            }

            result = ma_channel_map_apply_shuffle_table(pFramesOut, channelsOut, pFramesIn, channelsIn, frameCount, shuffleTable, ma_format_f32);
            if (result != MA_SUCCESS) {
                return;
            }
        } else {
            ma_uint32 iFrame;
            ma_uint32 iChannelOut;
            ma_uint32 iChannelIn;
            float weights[32][32];  /* Do not use MA_MAX_CHANNELS here! */

            /*
            If we have a small enough number of channels, pre-compute the weights. Otherwise we'll just need to
            fall back to a slower path because otherwise we'll run out of stack space.
            */
            if (channelsIn <= ma_countof(weights) && channelsOut <= ma_countof(weights)) {
                /* Pre-compute weights. */
                for (iChannelOut = 0; iChannelOut < channelsOut; iChannelOut += 1) {
                    ma_channel channelOut = ma_channel_map_get_channel(pChannelMapOut, channelsOut, iChannelOut);
                    for (iChannelIn = 0; iChannelIn < channelsIn; iChannelIn += 1) {
                        ma_channel channelIn = ma_channel_map_get_channel(pChannelMapIn, channelsIn, iChannelIn);
                        weights[iChannelOut][iChannelIn] = ma_calculate_channel_position_rectangular_weight(channelOut, channelIn);
                    }
                }

                for (iFrame = 0; iFrame < frameCount; iFrame += 1) {
                    for (iChannelOut = 0; iChannelOut < channelsOut; iChannelOut += 1) {
                        float accumulation = 0;

                        for (iChannelIn = 0; iChannelIn < channelsIn; iChannelIn += 1) {
                            accumulation += pFramesIn[iChannelIn] * weights[iChannelOut][iChannelIn];
                        }

                        pFramesOut[iChannelOut] = accumulation;
                    }

                    pFramesOut += channelsOut;
                    pFramesIn  += channelsIn;
                }
            } else {
                /* Cannot pre-compute weights because not enough room in stack-allocated buffer. */
                for (iFrame = 0; iFrame < frameCount; iFrame += 1) {
                    for (iChannelOut = 0; iChannelOut < channelsOut; iChannelOut += 1) {
                        float accumulation = 0;
                        ma_channel channelOut = ma_channel_map_get_channel(pChannelMapOut, channelsOut, iChannelOut);

                        for (iChannelIn = 0; iChannelIn < channelsIn; iChannelIn += 1) {
                            ma_channel channelIn = ma_channel_map_get_channel(pChannelMapIn, channelsIn, iChannelIn);
                            accumulation += pFramesIn[iChannelIn] * ma_calculate_channel_position_rectangular_weight(channelOut, channelIn);
                        }

                        pFramesOut[iChannelOut] = accumulation;
                    }

                    pFramesOut += channelsOut;
                    pFramesIn  += channelsIn;
                }
            }
        }
    } else {
        /* Fall back to silence. If you hit this, what are you doing with so many channels?! */
        ma_silence_pcm_frames(pFramesOut, frameCount, ma_format_f32, channelsOut);
    }
}